

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

char * epoll_event_flags_dump(epoll_event *ev)

{
  char *pcVar1;
  
  pcVar1 = epoll_flags_dump(ev._4_4_);
  return pcVar1;
}

Assistant:

const char *
epoll_event_flags_dump(const struct epoll_event *ev)
{
    return epoll_flags_dump(ev->events);
}